

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcTestSubcase.hpp
# Opt level: O3

SubcaseBasePtr deqp::TestSubcase::Create<glcts::(anonymous_namespace)::PlainGatherFloat2DRg>(void)

{
  TGBase *this;
  Functions *pFVar1;
  SharedPtrStateBase *extraout_RDX;
  SubcaseBase *in_RDI;
  SubcaseBasePtr SVar2;
  
  this = (TGBase *)operator_new(0x50);
  (this->super_SubcaseBase).super_GLWrapper._vptr_GLWrapper = (_func_int **)0x0;
  (this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper.m_gl = (Functions *)0x0;
  (this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper.m_log = (TestLog *)0x0;
  *(undefined8 *)&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper.m_enableLog = 0;
  (this->super_SubcaseBase).super_GLWrapper.m_context = (Context *)0x0;
  this->renderTarget = (RenderTarget *)0x0;
  this->pixelFormat = (PixelFormat *)0x0;
  this[1].super_SubcaseBase.super_GLWrapper._vptr_GLWrapper = (_func_int **)0x0;
  this[1].super_SubcaseBase.super_GLWrapper.super_CallLogWrapper.m_gl = (Functions *)0x0;
  this[1].super_SubcaseBase.super_GLWrapper.super_CallLogWrapper.m_log = (TestLog *)0x0;
  glcts::anon_unknown_0::TGBase::TGBase(this);
  (this->super_SubcaseBase).super_GLWrapper._vptr_GLWrapper =
       (_func_int **)&PTR__SubcaseBase_020f6db8;
  (in_RDI->super_GLWrapper).super_CallLogWrapper.m_gl = (Functions *)0x0;
  (in_RDI->super_GLWrapper)._vptr_GLWrapper = (_func_int **)this;
  pFVar1 = (Functions *)operator_new(0x20);
  *(undefined4 *)&pFVar1->activeTexture = 0;
  *(undefined4 *)((long)&pFVar1->activeTexture + 4) = 0;
  pFVar1->activeShaderProgram = (glActiveShaderProgramFunc)&PTR__SharedPtrState_020c83b0;
  pFVar1->attachShader = (glAttachShaderFunc)this;
  (in_RDI->super_GLWrapper).super_CallLogWrapper.m_gl = pFVar1;
  *(undefined4 *)&pFVar1->activeTexture = 1;
  *(undefined4 *)((long)&pFVar1->activeTexture + 4) = 1;
  SVar2.m_state = extraout_RDX;
  SVar2.m_ptr = in_RDI;
  return SVar2;
}

Assistant:

static SubcaseBase::SubcaseBasePtr Create()
	{
		return SubcaseBase::SubcaseBasePtr(new Type());
	}